

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data,char *name,double val)

{
  string_view valname;
  SmallBuffer *this;
  size_t sVar1;
  long in_RSI;
  __sv_type _Var2;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  SmallBuffer *in_stack_ffffffffffffff78;
  NamedPoint *in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffff90;
  double in_stack_ffffffffffffff98;
  NamedPoint *in_stack_ffffffffffffffa0;
  char *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  undefined4 local_4;
  
  this = getBuffer(in_stack_ffffffffffffff88);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    if (in_RSI == 0) {
      _Var2 = std::__cxx11::string::operator_cast_to_basic_string_view
                        (&in_stack_ffffffffffffff80->name);
      in_stack_ffffffffffffffa0 = (NamedPoint *)_Var2._M_len;
      in_stack_ffffffffffffffa8 = _Var2._M_str;
    }
    else {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    }
    valname._M_str = in_stack_ffffffffffffffb0;
    valname._M_len = (size_t)in_stack_ffffffffffffffa8;
    helics::NamedPoint::NamedPoint(in_stack_ffffffffffffffa0,valname,in_stack_ffffffffffffff98);
    helics::ValueConverter<helics::NamedPoint>::convert
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    helics::NamedPoint::~NamedPoint((NamedPoint *)0x1f3c24);
    sVar1 = helics::SmallBuffer::size(this);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

int32_t helicsDataBufferFillFromNamedPoint(HelicsDataBuffer data, const char* name, double val)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<helics::NamedPoint>::convert(helics::NamedPoint(AS_STRING_VIEW(name), val), *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}